

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O1

int Abc_NpnTest(char *pFileName,int NpnType,int nVarNum,int fDumpRes,int fBinary,int fVerbose)

{
  if (fVerbose != 0) {
    printf("Using truth tables from file \"%s\"...\n",pFileName);
  }
  if ((uint)NpnType < 0xc) {
    Abc_TruthNpnTest(pFileName,NpnType,nVarNum,fDumpRes,fBinary,fVerbose);
  }
  else {
    printf("Unknown canonical form value (%d).\n",NpnType);
  }
  fflush(_stdout);
  return 0;
}

Assistant:

int Abc_NpnTest( char * pFileName, int NpnType, int nVarNum, int fDumpRes, int fBinary, int fVerbose )
{
    if ( fVerbose )
        printf( "Using truth tables from file \"%s\"...\n", pFileName );
    if ( NpnType >= 0 && NpnType <= 11 )
        Abc_TruthNpnTest( pFileName, NpnType, nVarNum, fDumpRes, fBinary, fVerbose );
    else
        printf( "Unknown canonical form value (%d).\n", NpnType );
    fflush( stdout );
    return 0;
}